

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O0

bool ModActorFlag(AActor *actor,FString *flagname,bool set,bool printerror)

{
  int iVar1;
  FString type;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  MetaClass *type_00;
  char *pcVar5;
  char *pcVar6;
  bool local_ba;
  bool local_b9;
  TFlags<ActorFlag5,_unsigned_int> local_80;
  TFlags<ActorFlag,_unsigned_int> local_7c;
  undefined1 local_78 [8];
  FLinkContext ctx;
  bool linkchange;
  ActorFlags *flagp;
  TFlags<ActorFlag,_unsigned_int> local_50 [4];
  FString local_40;
  FString part1;
  PClassActor *cls;
  FFlagDef *fd;
  char *dot;
  bool found;
  bool printerror_local;
  bool set_local;
  FString *flagname_local;
  AActor *actor_local;
  
  dot._5_1_ = false;
  if (actor != (AActor *)0x0) {
    pcVar4 = FString::operator_cast_to_char_(flagname);
    pcVar4 = strchr(pcVar4,0x2e);
    type_00 = AActor::GetClass(actor);
    part1.Chars = (char *)type_00;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = FString::operator_cast_to_char_(flagname);
      cls = (PClassActor *)FindFlag(&type_00->super_PClass,pcVar4,(char *)0x0,false);
    }
    else {
      pcVar5 = FString::GetChars(flagname);
      pcVar6 = FString::operator_cast_to_char_(flagname);
      FString::FString(&local_40,pcVar5,(long)pcVar4 - (long)pcVar6);
      type = part1;
      pcVar5 = FString::operator_cast_to_char_(&local_40);
      cls = (PClassActor *)FindFlag((PClass *)type.Chars,pcVar5,pcVar4 + 1,false);
      FString::~FString(&local_40);
    }
    if (cls == (PClassActor *)0x0) {
      if (printerror) {
        pcVar4 = FString::GetChars(flagname);
        pcVar5 = FName::GetChars((FName *)(part1.Chars + 0xa0));
        DPrintf(1,"ACS/DECORATE: \'%s\' is not a flag in \'%s\'\n",pcVar4,pcVar5);
      }
    }
    else {
      dot._5_1_ = true;
      bVar2 = AActor::CountsAsKill(actor);
      if ((bVar2) && (0 < actor->health)) {
        level.total_monsters = level.total_monsters + -1;
      }
      iVar1 = (int)actor;
      TFlags<ActorFlag,_unsigned_int>::operator&
                (local_50,iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|
                                   MF_NOSECTOR|MF_SHOOTABLE));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)local_50);
      if (uVar3 != 0) {
        level.total_items = level.total_items + -1;
      }
      TFlags<ActorFlag5,_unsigned_int>::operator&
                ((TFlags<ActorFlag5,_unsigned_int> *)((long)&flagp + 4),
                 iVar1 + (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|
                         MF5_NODROPOFF));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&flagp + 4));
      if (uVar3 != 0) {
        level.total_secrets = level.total_secrets + -1;
      }
      if (*(int *)((long)&(cls->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                          super_PCompoundType.super_PType.super_PTypeBase + 0x10) == -1) {
        HandleDeprecatedFlags
                  (actor,(PClassActor *)part1.Chars,set,
                   *(int *)&(cls->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                            super_PCompoundType.super_PType.super_PTypeBase);
      }
      else {
        local_b9 = false;
        if ((ActorFlags *)
            ((long)&(actor->super_DThinker).super_DObject._vptr_DObject +
            (long)*(int *)((long)&(cls->super_PClass).super_PNativeStruct.super_PStruct.
                                  super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase +
                          0x10)) == &actor->flags) {
          local_ba = true;
          if (*(int *)&(cls->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                       super_PCompoundType.super_PType.super_PTypeBase != 0x10) {
            local_ba = *(int *)&(cls->super_PClass).super_PNativeStruct.super_PStruct.
                                super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase ==
                       8;
          }
          local_b9 = local_ba;
        }
        ctx.render_list._7_1_ = local_b9;
        FLinkContext::FLinkContext((FLinkContext *)local_78);
        if ((ctx.render_list._7_1_ & 1) != 0) {
          AActor::UnlinkFromWorld(actor,(FLinkContext *)local_78);
        }
        ModActorFlag(actor,(FFlagDef *)cls,set);
        if ((ctx.render_list._7_1_ & 1) != 0) {
          AActor::LinkToWorld(actor,(FLinkContext *)local_78,false,(sector_t *)0x0);
        }
      }
      bVar2 = AActor::CountsAsKill(actor);
      if ((bVar2) && (0 < actor->health)) {
        level.total_monsters = level.total_monsters + 1;
      }
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_7c,
                 iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                         MF_SHOOTABLE));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_7c);
      if (uVar3 != 0) {
        level.total_items = level.total_items + 1;
      }
      TFlags<ActorFlag5,_unsigned_int>::operator&
                (&local_80,
                 iVar1 + (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|
                         MF5_NODROPOFF));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_80);
      if (uVar3 != 0) {
        level.total_secrets = level.total_secrets + 1;
      }
    }
  }
  return dot._5_1_;
}

Assistant:

bool ModActorFlag(AActor *actor, FString &flagname, bool set, bool printerror)
{
	bool found = false;

	if (actor != NULL)
	{
		const char *dot = strchr(flagname, '.');
		FFlagDef *fd;
		PClassActor *cls = actor->GetClass();

		if (dot != NULL)
		{
			FString part1(flagname.GetChars(), dot - flagname);
			fd = FindFlag(cls, part1, dot + 1);
		}
		else
		{
			fd = FindFlag(cls, flagname, NULL);
		}

		if (fd != NULL)
		{
			found = true;

			if (actor->CountsAsKill() && actor->health > 0) --level.total_monsters;
			if (actor->flags & MF_COUNTITEM) --level.total_items;
			if (actor->flags5 & MF5_COUNTSECRET) --level.total_secrets;

			if (fd->structoffset == -1)
			{
				HandleDeprecatedFlags(actor, cls, set, fd->flagbit);
			}
			else
			{
				ActorFlags *flagp = (ActorFlags*)(((char*)actor) + fd->structoffset);

				// If these 2 flags get changed we need to update the blockmap and sector links.
				bool linkchange = flagp == &actor->flags && (fd->flagbit == MF_NOBLOCKMAP || fd->flagbit == MF_NOSECTOR);

				FLinkContext ctx;
				if (linkchange) actor->UnlinkFromWorld(&ctx);
				ModActorFlag(actor, fd, set);
				if (linkchange) actor->LinkToWorld(&ctx);
			}

			if (actor->CountsAsKill() && actor->health > 0) ++level.total_monsters;
			if (actor->flags & MF_COUNTITEM) ++level.total_items;
			if (actor->flags5 & MF5_COUNTSECRET) ++level.total_secrets;
		}
		else if (printerror)
		{
			DPrintf(DMSG_ERROR, "ACS/DECORATE: '%s' is not a flag in '%s'\n", flagname.GetChars(), cls->TypeName.GetChars());
		}
	}

	return found;
}